

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<float>_>::MultiplyByScalar
          (TPZMatrix<Fad<float>_> *this,Fad<float> *alpha,TPZMatrix<Fad<float>_> *res)

{
  uint uVar1;
  ulong uVar2;
  Fad<float> local_d0;
  TPZFMatrixRef<Fad<float>_> local_b0;
  
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
  local_d0.val_ = alpha->val_;
  uVar1 = (alpha->dx_).num_elts;
  local_d0.dx_.ptr_to_data = (float *)0x0;
  local_d0.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 << 2;
    }
    local_d0.dx_.ptr_to_data = (float *)operator_new__(uVar2);
    MEM_CPY<float>::copy
              ((MEM_CPY<float> *)local_d0.dx_.ptr_to_data,(EVP_PKEY_CTX *)(alpha->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_d0.defaultVal = alpha->defaultVal;
  Storage(&local_b0,res);
  TPZFMatrix<Fad<float>_>::operator*=(&local_b0.super_TPZFMatrix<Fad<float>_>,&local_d0);
  TPZFMatrixRef<Fad<float>_>::~TPZFMatrixRef(&local_b0,&TPZFMatrixRef<Fad<float>>::VTT);
  Fad<float>::~Fad(&local_d0);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}